

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O0

JL_STATUS JlAddBoolToListObject(JlDataObject *ListObject,_Bool BoolValue)

{
  JlDataObject *local_20;
  JlDataObject *boolObject;
  JL_STATUS jlStatus;
  _Bool BoolValue_local;
  JlDataObject *ListObject_local;
  
  local_20 = (JlDataObject *)0x0;
  if (ListObject == (JlDataObject *)0x0) {
    boolObject._0_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    boolObject._7_1_ = BoolValue;
    _jlStatus = ListObject;
    boolObject._0_4_ = JlCreateBoolObject(BoolValue,&local_20);
    if (((JL_STATUS)boolObject == JL_STATUS_SUCCESS) &&
       (boolObject._0_4_ = JlAttachObjectToListObject(_jlStatus,local_20),
       (JL_STATUS)boolObject != JL_STATUS_SUCCESS)) {
      JlFreeObjectTree(&local_20);
    }
  }
  return (JL_STATUS)boolObject;
}

Assistant:

JL_STATUS
    JlAddBoolToListObject
    (
        JlDataObject*       ListObject,         // [in,out]
        bool                BoolValue           // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* boolObject = NULL;

    if( NULL != ListObject )
    {
        jlStatus = JlCreateBoolObject( BoolValue, &boolObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToListObject( ListObject, boolObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &boolObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}